

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

void __thiscall
QOpenGLShaderProgram::setUniformValueArray
          (QOpenGLShaderProgram *this,int location,QMatrix4x4 *values,int count)

{
  long lVar1;
  undefined1 *puVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QVarLengthArray<float,_256LL> temp;
  long local_450;
  ulong local_448;
  undefined1 *local_440;
  undefined1 local_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < count && location != -1) {
    lVar1 = *(long *)&this->field_0x8;
    memset(&local_450,0xaa,0x418);
    local_450 = 0x100;
    local_448 = 0;
    local_440 = local_438;
    if (0x100 < (uint)(count << 4)) {
      setUniformValueArray();
    }
    if (0 < count) {
      uVar3 = 0;
      puVar2 = local_440;
      do {
        lVar4 = 0;
        do {
          *(float *)(puVar2 + lVar4 * 4) = values->m[0][lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        uVar3 = uVar3 + 1;
        puVar2 = puVar2 + 0x40;
        values = values + 1;
      } while (uVar3 != (uint)count);
    }
    local_448 = (ulong)(uint)(count << 4);
    (**(code **)(**(long **)(lVar1 + 0xd0) + 0x410))(location,count,0,local_440);
    if (local_440 != local_438) {
      QtPrivate::sizedFree(local_440,local_450 << 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValueArray(int location, const QMatrix4x4 *values, int count)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    setUniformMatrixArray
        (d->glfuncs->glUniformMatrix4fv, location, values, count, QMatrix4x4, 4, 4);
}